

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls.cpp
# Opt level: O0

void __thiscall ot::commissioner::DtlsSession::HandleEvent(DtlsSession *this,short aFlags)

{
  bool bVar1;
  bool bVar2;
  Error *aError;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar3;
  string_view fmt;
  format_args args;
  byte local_32d;
  Error local_308;
  Error local_2e0;
  string local_2b8;
  DtlsSession *local_298;
  anon_class_1_0_00000001 local_28a;
  v10 local_289;
  v10 *local_288;
  char *local_280;
  string local_278;
  allocator local_251;
  string local_250;
  Error local_230;
  byte local_201;
  Error local_200;
  Error local_1d8;
  ErrorCode local_1ac;
  Error local_1a8;
  Error local_180;
  ErrorCode local_158 [4];
  Error local_148;
  undefined1 local_120 [8];
  Error error;
  short aFlags_local;
  DtlsSession *this_local;
  undefined1 local_b0 [16];
  v10 *local_a0;
  char *local_98;
  string *local_90;
  void **local_88;
  v10 *local_80;
  v10 *local_78;
  char *pcStack_70;
  string *local_68;
  v10 *local_60;
  v10 **local_58;
  v10 **local_50;
  v10 *local_48;
  char *pcStack_40;
  DtlsSession **local_38;
  undefined1 *local_30;
  DtlsSession **local_28;
  DtlsSession **local_20;
  undefined8 local_18;
  undefined1 *local_10;
  
  error.mMessage.field_2._14_2_ = aFlags;
  Error::Error((Error *)local_120);
  if (((this->mIsServer & 1U) != 0) && ((this->mIsClientIdSet & 1U) == 0)) {
    SetClientTransportId(&local_148,this);
    aError = Error::operator=((Error *)local_120,&local_148);
    local_158[0] = kNone;
    bVar1 = commissioner::operator!=(aError,local_158);
    Error::~Error(&local_148);
    if (bVar1) goto LAB_002dcfb7;
  }
  if (this->mState == kConnecting) {
    Handshake(&local_180,this);
    Error::operator=((Error *)local_120,&local_180);
    Error::~Error(&local_180);
    Error::Error(&local_1a8,(Error *)local_120);
    bVar2 = ShouldStop(&local_1a8);
    bVar1 = true;
    if (!bVar2) {
      bVar1 = this->mState != kConnected;
    }
    Error::~Error(&local_1a8);
    if (bVar1) goto LAB_002dcfb7;
  }
  else if (this->mState != kConnected) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_250,"dtls",&local_251);
    HandleEvent::anon_class_1_0_00000001::operator()(&local_28a);
    local_58 = &local_288;
    local_60 = &local_289;
    bVar3 = ::fmt::v10::operator()(local_60);
    local_280 = (char *)bVar3.size_;
    local_288 = (v10 *)bVar3.data_;
    ::fmt::v10::detail::
    check_format_string<void_*,_short_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FMT_COMPILE_STRING,_0>
              ();
    local_298 = this;
    GetStateString_abi_cxx11_(&local_2b8,this);
    local_68 = &local_278;
    local_78 = local_288;
    pcStack_70 = local_280;
    local_80 = (v10 *)&local_298;
    local_88 = (void **)((long)&error.mMessage.field_2 + 0xe);
    local_90 = &local_2b8;
    local_50 = &local_78;
    local_a0 = local_288;
    local_98 = local_280;
    local_48 = local_a0;
    pcStack_40 = local_98;
    ::fmt::v10::
    make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,void*,short,std::__cxx11::string>
              ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_void_*,_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&this_local,local_80,local_88,(short *)local_90,in_R8);
    local_30 = local_b0;
    local_38 = &this_local;
    local_18 = 0xd1e;
    fmt.size_ = 0xd1e;
    fmt.data_ = local_98;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_38;
    local_28 = local_38;
    local_20 = local_38;
    local_10 = local_30;
    ::fmt::v10::vformat_abi_cxx11_(&local_278,local_a0,fmt,args);
    Log(kDebug,&local_250,&local_278);
    std::__cxx11::string::~string((string *)&local_278);
    std::__cxx11::string::~string((string *)&local_2b8);
    std::__cxx11::string::~string((string *)&local_250);
    std::allocator<char>::~allocator((allocator<char> *)&local_251);
    goto LAB_002dcfb7;
  }
  if ((error.mMessage.field_2._14_2_ & 2) != 0) {
    while( true ) {
      local_1ac = kNone;
      bVar1 = commissioner::operator==((Error *)local_120,&local_1ac);
      if (!bVar1) break;
      Read(&local_1d8,this);
      Error::operator=((Error *)local_120,&local_1d8);
      Error::~Error(&local_1d8);
    }
  }
  local_201 = 0;
  local_32d = 0;
  if ((error.mMessage.field_2._14_2_ & 4) != 0) {
    Error::Error(&local_200,(Error *)local_120);
    local_201 = 1;
    bVar1 = ShouldStop(&local_200);
    local_32d = bVar1 ^ 0xff;
  }
  if ((local_201 & 1) != 0) {
    Error::~Error(&local_200);
  }
  if ((local_32d & 1) != 0) {
    TryWrite(&local_230,this);
    Error::operator=((Error *)local_120,&local_230);
    Error::~Error(&local_230);
  }
LAB_002dcfb7:
  Error::Error(&local_2e0,(Error *)local_120);
  bVar1 = ShouldStop(&local_2e0);
  Error::~Error(&local_2e0);
  if (bVar1) {
    Error::Error(&local_308,(Error *)local_120);
    Disconnect(this,&local_308);
    Error::~Error(&local_308);
  }
  Error::~Error((Error *)local_120);
  return;
}

Assistant:

void DtlsSession::HandleEvent(short aFlags)
{
    Error error;

    if (mIsServer && !mIsClientIdSet)
    {
        SuccessOrExit(error = SetClientTransportId());
    }

    switch (mState)
    {
    case State::kConnecting:
        error = Handshake();
        if (ShouldStop(error) || mState != State::kConnected)
        {
            break;
        }

        // Fall through

    case State::kConnected:
        if (aFlags & EV_READ)
        {
            while (error == ErrorCode::kNone)
            {
                error = Read();
            }
        }
        if ((aFlags & EV_WRITE) && !ShouldStop(error))
        {
            error = TryWrite();
        }
        break;

    default:
        // Ignore incoming data when the DTLS session is disconnected.

        LOG_DEBUG(LOG_REGION_DTLS, "session(={}) received event {:X} in state {}", static_cast<void *>(this), aFlags,
                  GetStateString());
        break;
    }

exit:
    if (ShouldStop(error))
    {
        Disconnect(error);
    }
}